

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.cpp
# Opt level: O2

void assertion_fail(string_view file,int line,string_view func,string_view assertion)

{
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa8;
  int line_local;
  string_view func_local;
  string_view file_local;
  string str;
  
  func_local._M_str = func._M_str;
  func_local._M_len = func._M_len;
  file_local._M_str = file._M_str;
  file_local._M_len = file._M_len;
  line_local = line;
  tinyformat::
  format<std::basic_string_view<char,std::char_traits<char>>,int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            (&str,(tinyformat *)"%s:%s %s: Assertion `%s\' failed.\n",(char *)&file_local,
             (basic_string_view<char,_std::char_traits<char>_> *)&line_local,(int *)&func_local,
             &assertion,in_stack_ffffffffffffffa8);
  fwrite(str._M_dataplus._M_p,1,str._M_string_length,_stderr);
  abort();
}

Assistant:

void assertion_fail(std::string_view file, int line, std::string_view func, std::string_view assertion)
{
    auto str = strprintf("%s:%s %s: Assertion `%s' failed.\n", file, line, func, assertion);
    fwrite(str.data(), 1, str.size(), stderr);
    std::abort();
}